

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

QModelIndex * __thiscall
QtMWidgets::PickerPrivate::indexForPos
          (QModelIndex *__return_storage_ptr__,PickerPrivate *this,QPoint *pos)

{
  int iVar1;
  int atop;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int local_5c;
  QPersistentModelIndex local_58 [4];
  int j;
  QPersistentModelIndex index;
  QRect local_40;
  undefined1 local_30 [8];
  QRect r;
  int i;
  int offset;
  QPoint *pos_local;
  PickerPrivate *this_local;
  
  r.y2 = this->drawItemOffset;
  r.x2 = 0;
  while( true ) {
    if (this->itemsCount + 1 <= r.x2) {
      QModelIndex::QModelIndex(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_40 = QWidget::rect(&this->q->super_QWidget);
    iVar2 = QRect::x(&local_40);
    atop = r.y2;
    iVar1 = this->itemSideMargin;
    _index = QWidget::rect(&this->q->super_QWidget);
    iVar3 = QRect::width((QRect *)&index);
    QRect::QRect((QRect *)local_30,iVar2 + iVar1,atop,iVar3 - this->itemSideMargin,
                 this->stringHeight);
    uVar4 = QRect::contains((QPoint *)local_30,SUB81(pos,0));
    if ((uVar4 & 1) != 0) break;
    r.y2 = this->stringHeight + this->itemTopMargin + r.y2;
    r.x2 = r.x2 + 1;
  }
  QPersistentModelIndex::QPersistentModelIndex(local_58,&this->topItemIndex);
  for (local_5c = 0; local_5c < r.x2; local_5c = local_5c + 1) {
    makeNextIndex(this,local_58);
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QPersistentModelIndex *)__return_storage_ptr__);
  QPersistentModelIndex::~QPersistentModelIndex(local_58);
  return __return_storage_ptr__;
}

Assistant:

QModelIndex
PickerPrivate::indexForPos( const QPoint & pos )
{
	int offset = drawItemOffset;

	for( int i = 0; i < itemsCount + 1; ++i )
	{
		const QRect r( q->rect().x() + itemSideMargin, offset,
			q->rect().width() - itemSideMargin, stringHeight );

		if( r.contains( pos ) )
		{
			QPersistentModelIndex index = topItemIndex;

			for( int j = 0; j < i; ++j )
				makeNextIndex( index );

			return index;
		}

		offset += stringHeight + itemTopMargin;
	}

	return QModelIndex();
}